

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectViewport
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_4)

{
  bool bVar1;
  size_t sVar2;
  SyntaxNode *in_RCX;
  size_t in_RDI;
  size_t unaff_retaddr;
  anon_class_16_2_3edefdfa *in_stack_00000008;
  string_view in_stack_00000010;
  anon_class_16_2_3edefdfa checkOption;
  char *__str;
  undefined1 in_stack_ffffffffffffff90 [16];
  Preprocessor *this_00;
  SourceRange in_stack_ffffffffffffffa0;
  Token *in_stack_ffffffffffffffb0;
  DiagCode code;
  
  this_00 = in_stack_ffffffffffffff90._8_8_;
  if ((in_RCX != (SyntaxNode *)0x0) && (in_RCX->kind == ParenPragmaExpression)) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(in_RCX);
    sVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24dcb1);
    this_00 = in_stack_ffffffffffffff90._8_8_;
    __str = in_stack_ffffffffffffff90._0_8_;
    if (sVar2 == 2) {
      sv(__str,in_RDI);
      bVar1 = handleProtectViewport::anon_class_16_2_3edefdfa::operator()
                        (in_stack_00000008,unaff_retaddr,in_stack_00000010);
      if (!bVar1) {
        return;
      }
      sv(__str,in_RDI);
      handleProtectViewport::anon_class_16_2_3edefdfa::operator()
                (in_stack_00000008,unaff_retaddr,in_stack_00000010);
      return;
    }
  }
  if (in_RCX == (SyntaxNode *)0x0) {
    Token::range(in_stack_ffffffffffffffb0);
    code = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
  }
  else {
    slang::syntax::SyntaxNode::sourceRange(in_RCX);
    code = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
  }
  addDiag(this_00,code,in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void Preprocessor::handleProtectViewport(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.size() != 2) {
        addDiag(diag::InvalidPragmaViewport, args ? args->sourceRange() : keyword.range());
        return;
    }

    auto checkOption = [&](size_t index, std::string_view name) {
        auto syntax = args->as<ParenPragmaExpressionSyntax>().values[index];
        if (syntax->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::InvalidPragmaViewport, syntax->sourceRange());
            return false;
        }

        auto& nvp = syntax->as<NameValuePragmaExpressionSyntax>();
        if (nvp.name.valueText() != name) {
            addDiag(diag::InvalidPragmaViewport, nvp.name.range());
            return false;
        }

        if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
            nvp.value->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {
            addDiag(diag::InvalidPragmaViewport, nvp.value->sourceRange());
            return false;
        }

        return true;
    };

    if (!checkOption(0, "object"sv))
        return;

    checkOption(1, "access"sv);
}